

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  _Alloc_hider local_40;
  ulong local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  if ((((2 < (this->_path)._M_string_length) &&
       (pcVar2 = (this->_path)._M_dataplus._M_p, *pcVar2 == '/')) && (pcVar2[1] == '/')) &&
     ((pcVar2[2] != 0x2f && (iVar5 = isprint((int)pcVar2[2]), iVar5 != 0)))) {
    std::__cxx11::string::find((char)this,0x2f);
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
  uVar4 = local_38;
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
  if ((uint *)local_40._M_p == &local_30) {
    *(uint *)paVar1 = local_30;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 4) = uStack_2c;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_28;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 0xc) = uStack_24;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = local_40._M_p;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity = CONCAT44(uStack_2c,local_30);
  }
  (__return_storage_ptr__->_path)._M_string_length = local_38;
  local_38 = 0;
  local_30 = local_30 & 0xffffff00;
  local_40._M_p = (pointer)&local_30;
  if (((uVar4 < 3) || (pcVar2 = (__return_storage_ptr__->_path)._M_dataplus._M_p, *pcVar2 != '/'))
     || ((pcVar2[1] != '/' || (pcVar2[2] == '/')))) {
    pcVar3 = (__return_storage_ptr__->_path)._M_dataplus._M_p;
    _Var6 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar3,pcVar3 + uVar4);
  }
  else {
    _Var6 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar2 + 2,pcVar2 + uVar4);
  }
  (__return_storage_ptr__->_path)._M_string_length =
       (long)_Var6._M_current - (long)(__return_storage_ptr__->_path)._M_dataplus._M_p;
  *_Var6._M_current = '\0';
  if ((uint *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_name() const
{
    return path(_path.substr(_prefixLength, root_name_length()), native_format);
}